

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_node.cpp
# Opt level: O3

void duckdb::Node16::ShrinkNode48(ART *art,Node *node16,Node *node48)

{
  ulong uVar1;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var2;
  uint16_t i;
  BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4> *pBVar3;
  type paVar4;
  iterator iVar5;
  pointer this;
  data_ptr_t pdVar6;
  long lVar7;
  byte bVar8;
  ulong local_38;
  
  pBVar3 = BaseNode<(unsigned_char)'\x10',_(duckdb::NType)4>::New(art,node16);
  uVar1 = (node48->super_IndexPointer).data;
  paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  _Var2._M_head_impl =
       paVar4->_M_elems[4].
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
  local_38 = uVar1 & 0xffffffff;
  iVar5 = ::std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&((_Var2._M_head_impl)->buffers)._M_h,&local_38);
  this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
         operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                     *)((long)iVar5.
                              super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                              ._M_cur + 0x10));
  pdVar6 = FixedSizeBuffer::Get(this,true);
  pdVar6 = pdVar6 + (_Var2._M_head_impl)->bitmask_offset +
                    (ulong)((uint)(uVar1 >> 0x20) & 0xffffff) * (_Var2._M_head_impl)->segment_size;
  (node16->super_IndexPointer).data =
       (node48->super_IndexPointer).data & 0x8000000000000000 |
       (node16->super_IndexPointer).data & 0x7fffffffffffffff;
  pBVar3->count = '\0';
  lVar7 = 0;
  bVar8 = 0;
  do {
    if (pdVar6[lVar7 + 1] != '0') {
      pBVar3->key[bVar8] = (uint8_t)lVar7;
      pBVar3->children[bVar8].super_IndexPointer.data =
           *(idx_t *)(pdVar6 + (ulong)pdVar6[lVar7 + 1] * 8 + 0x108);
      bVar8 = bVar8 + 1;
      pBVar3->count = bVar8;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x100);
  *pdVar6 = '\0';
  Node::Free(art,node48);
  return;
}

Assistant:

void Node16::ShrinkNode48(ART &art, Node &node16, Node &node48) {
	auto &n16 = New(art, node16);
	auto &n48 = Node::Ref<Node48>(art, node48, NType::NODE_48);
	node16.SetGateStatus(node48.GetGateStatus());

	n16.count = 0;
	for (uint16_t i = 0; i < Node256::CAPACITY; i++) {
		if (n48.child_index[i] != Node48::EMPTY_MARKER) {
			n16.key[n16.count] = UnsafeNumericCast<uint8_t>(i);
			n16.children[n16.count] = n48.children[n48.child_index[i]];
			n16.count++;
		}
	}

	n48.count = 0;
	Node::Free(art, node48);
}